

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QRegion __thiscall QTableView::visualRegionForSelection(QTableView *this,QItemSelection *selection)

{
  QModelIndex *__return_storage_ptr__;
  QSpanCollection *pQVar1;
  QPersistentModelIndex *rhs;
  QTableViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  Span *pSVar3;
  Span *span;
  QRect QVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Representation RVar14;
  Representation RVar15;
  ulong uVar16;
  long in_RDX;
  QItemSelectionRange *pQVar17;
  QItemSelectionRange *pQVar18;
  QItemSelectionRange *pQVar19;
  long in_FS_OFFSET;
  QRect QVar20;
  QSet<QSpanCollection::Span_*> spansInRect;
  piter local_b8;
  QSpanCollection local_a0;
  QRect local_78;
  undefined1 local_68 [32];
  QRect local_48;
  long local_38;
  
  QVar20._8_8_ = local_78._8_8_;
  QVar20._0_8_ = local_78._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0052d292;
    QRegion::QRegion((QRegion *)this);
  }
  else {
    this_00 = (QTableViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
    *(undefined1 **)
     &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    local_48 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.viewport);
    bVar5 = QHeaderView::sectionsMoved
                      ((QHeaderView *)(selection->super_QList<QItemSelectionRange>).d.ptr[0x58].br.d
                      );
    bVar6 = QHeaderView::sectionsMoved
                      ((QHeaderView *)(selection->super_QList<QItemSelectionRange>).d.ptr[0x58].tl.d
                      );
    QVar4.x2.m_i = local_78.x2.m_i;
    QVar4.y2.m_i = local_78.y2.m_i;
    QVar4.x1.m_i = local_78.x1.m_i;
    QVar4.y1.m_i = local_78.y1.m_i;
    if ((bVar5 && bVar6) ||
       ((pQVar1 = &this_00->spans, bVar5 || bVar6 &&
        ((QSpanCollection *)
         (this_00->spans).spans.
         super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl
         ._M_node.super__List_node_base._M_next != pQVar1)))) {
      pQVar18 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar17 = pQVar18 + *(long *)(in_RDX + 0x10);
      rhs = &(this_00->super_QAbstractItemViewPrivate).root;
      __return_storage_ptr__ =
           (QModelIndex *)
           ((long)&local_a0.spans.
                   super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                   ._M_impl._M_node.super__List_node_base + 8);
      local_78 = QVar4;
      for (; QVar20 = local_78, pQVar18 != pQVar17; pQVar18 = pQVar18 + 1) {
        QPersistentModelIndex::parent();
        bVar5 = ::operator!=((QModelIndex *)local_68,rhs);
        if (!bVar5) {
          bVar5 = QItemSelectionRange::isValid(pQVar18);
          if (bVar5) {
            iVar8 = QPersistentModelIndex::row();
            while( true ) {
              iVar9 = QPersistentModelIndex::row();
              if (iVar9 < iVar8) break;
              iVar9 = QPersistentModelIndex::column();
              while( true ) {
                iVar10 = QPersistentModelIndex::column();
                if (iVar10 < iVar9) break;
                pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
                QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,rhs);
                (**(code **)(*(long *)pQVar2 + 0x60))
                          ((QModelIndex *)local_68,pQVar2,iVar8,iVar9,__return_storage_ptr__);
                QVar20 = (QRect)(**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e]
                                             .super_QArrayData)(selection,(QModelIndex *)local_68);
                local_78 = QVar20;
                cVar7 = QRect::intersects(&local_48);
                if (cVar7 != '\0') {
                  QRegion::operator+=((QRegion *)this,&local_78);
                }
                iVar9 = iVar9 + 1;
              }
              iVar8 = iVar8 + 1;
            }
          }
        }
      }
    }
    else if (bVar6) {
      pQVar18 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar17 = pQVar18 + *(long *)(in_RDX + 0x10);
      for (; QVar20.x2.m_i = local_78.x2.m_i, QVar20.y2.m_i = local_78.y2.m_i,
          QVar20.x1.m_i = local_78.x1.m_i, QVar20.y1.m_i = local_78.y1.m_i, pQVar18 != pQVar17;
          pQVar18 = pQVar18 + 1) {
        QPersistentModelIndex::parent();
        bVar5 = ::operator!=((QModelIndex *)local_68,&(this_00->super_QAbstractItemViewPrivate).root
                            );
        if ((!bVar5) && (bVar5 = QItemSelectionRange::isValid(pQVar18), bVar5)) {
          iVar8 = QPersistentModelIndex::row();
          iVar10 = rowViewportPosition((QTableView *)selection,iVar8);
          iVar8 = QPersistentModelIndex::row();
          iVar8 = rowViewportPosition((QTableView *)selection,iVar8);
          iVar9 = QPersistentModelIndex::row();
          iVar9 = rowHeight((QTableView *)selection,iVar9);
          iVar9 = iVar9 + iVar8;
          iVar8 = iVar9;
          if (iVar9 < iVar10) {
            iVar8 = iVar10;
          }
          if (iVar10 < iVar9) {
            iVar9 = iVar10;
          }
          iVar10 = QPersistentModelIndex::column();
          for (; iVar11 = QPersistentModelIndex::column(), iVar10 <= iVar11; iVar10 = iVar10 + 1) {
            local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            iVar11 = columnViewportPosition((QTableView *)selection,iVar10);
            iVar12 = columnWidth((QTableView *)selection,iVar10);
            local_68._4_4_ = iVar9;
            local_68._0_4_ = iVar11;
            local_68._8_4_ = iVar12 + iVar11 + -1;
            local_68._12_4_ = iVar8 + -1;
            cVar7 = QRect::intersects(&local_48);
            if (cVar7 != '\0') {
              QRegion::operator+=((QRegion *)this,(QRect *)local_68);
            }
          }
        }
      }
    }
    else if (bVar5) {
      pQVar18 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar17 = pQVar18 + *(long *)(in_RDX + 0x10);
      for (; QVar20.x2.m_i = local_78.x2.m_i, QVar20.y2.m_i = local_78.y2.m_i,
          QVar20.x1.m_i = local_78.x1.m_i, QVar20.y1.m_i = local_78.y1.m_i, pQVar18 != pQVar17;
          pQVar18 = pQVar18 + 1) {
        QPersistentModelIndex::parent();
        bVar5 = ::operator!=((QModelIndex *)local_68,&(this_00->super_QAbstractItemViewPrivate).root
                            );
        if ((!bVar5) && (bVar5 = QItemSelectionRange::isValid(pQVar18), bVar5)) {
          iVar8 = QPersistentModelIndex::column();
          iVar10 = columnViewportPosition((QTableView *)selection,iVar8);
          iVar8 = QPersistentModelIndex::column();
          iVar8 = columnViewportPosition((QTableView *)selection,iVar8);
          iVar9 = QPersistentModelIndex::column();
          iVar9 = columnWidth((QTableView *)selection,iVar9);
          iVar9 = iVar9 + iVar8;
          iVar8 = iVar9;
          if (iVar10 < iVar9) {
            iVar8 = iVar10;
          }
          if (iVar9 < iVar10) {
            iVar9 = iVar10;
          }
          iVar10 = QPersistentModelIndex::row();
          for (; iVar11 = QPersistentModelIndex::row(), iVar10 <= iVar11; iVar10 = iVar10 + 1) {
            local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            iVar11 = rowViewportPosition((QTableView *)selection,iVar10);
            iVar12 = rowHeight((QTableView *)selection,iVar10);
            local_68._4_4_ = iVar11;
            local_68._0_4_ = iVar8;
            local_68._8_4_ = iVar9 + -1;
            local_68._12_4_ = iVar11 + -1 + iVar12;
            cVar7 = QRect::intersects(&local_48);
            if (cVar7 != '\0') {
              QRegion::operator+=((QRegion *)this,(QRect *)local_68);
            }
          }
        }
      }
    }
    else {
      pQVar17 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar19 = pQVar17 + *(long *)(in_RDX + 0x10);
      uVar13 = ~(int)*(char *)&(selection->super_QList<QItemSelectionRange>).d.ptr[0x54].tl.d;
      pQVar18 = (QItemSelectionRange *)
                ((long)&local_a0.spans.
                        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                        ._M_impl._M_node.super__List_node_base + 8);
      for (; QVar20.x2.m_i = local_78.x2.m_i, QVar20.y2.m_i = local_78.y2.m_i,
          QVar20.x1.m_i = local_78.x1.m_i, QVar20.y1.m_i = local_78.y1.m_i, pQVar17 != pQVar19;
          pQVar17 = pQVar17 + 1) {
        local_a0.spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
        local_a0.spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node._M_size = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        QItemSelectionRange::QItemSelectionRange(pQVar18,pQVar17);
        QPersistentModelIndex::parent();
        bVar5 = ::operator!=((QModelIndex *)local_68,&(this_00->super_QAbstractItemViewPrivate).root
                            );
        if ((!bVar5) && (bVar5 = QItemSelectionRange::isValid(pQVar18), bVar5)) {
          QTableViewPrivate::trimHiddenSelections(this_00,pQVar18);
          iVar8 = QPersistentModelIndex::row();
          RVar14.m_i = rowViewportPosition((QTableView *)selection,iVar8);
          iVar8 = QPersistentModelIndex::row();
          iVar8 = rowViewportPosition((QTableView *)selection,iVar8);
          iVar9 = QPersistentModelIndex::row();
          iVar9 = rowHeight((QTableView *)selection,iVar9);
          QWidget::isLeftToRight((QWidget *)selection);
          iVar10 = QPersistentModelIndex::column();
          RVar15.m_i = columnViewportPosition((QTableView *)selection,iVar10);
          iVar10 = QPersistentModelIndex::column();
          iVar10 = columnViewportPosition((QTableView *)selection,iVar10);
          iVar11 = QPersistentModelIndex::column();
          iVar11 = columnWidth((QTableView *)selection,iVar11);
          local_78.y1.m_i = RVar14.m_i;
          local_78.x1.m_i = RVar15.m_i;
          local_78.y2.m_i = iVar8 + uVar13 + iVar9;
          local_78.x2.m_i = iVar11 + iVar10 + uVar13;
          cVar7 = QRect::intersects(&local_48);
          if (cVar7 != '\0') {
            QRegion::operator+=((QRegion *)this,&local_78);
          }
          if ((QSpanCollection *)
              (pQVar1->spans).
              super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
              _M_impl._M_node.super__List_node_base._M_next != pQVar1) {
            local_a0.spans.
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa
            ;
            iVar8 = QPersistentModelIndex::column();
            iVar9 = QPersistentModelIndex::row();
            iVar10 = QItemSelectionRange::width(pQVar18);
            QItemSelectionRange::height(pQVar18);
            QSpanCollection::spansInRect(&local_a0,(int)pQVar1,iVar8,iVar9,iVar10);
            local_b8.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
            local_b8.d = (Data<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> *)
                         &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (piter)QHash<QSpanCollection::Span_*,_QHashDummyValue>::begin
                                        ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)
                                         &local_a0);
            while( true ) {
              if (local_b8.d ==
                  (Data<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_> *)0x0 &&
                  local_b8.bucket == 0) break;
              pSVar3 = (local_b8.d)->spans;
              uVar16 = local_b8.bucket >> 7;
              span = *(Span **)pSVar3[uVar16].entries
                               [pSVar3[uVar16].offsets[(uint)local_b8.bucket & 0x7f]].storage.data;
              iVar8 = span->m_top;
              iVar9 = span->m_left;
              QPersistentModelIndex::parent();
              bVar5 = QItemSelectionRange::contains(pQVar18,iVar8,iVar9,(QModelIndex *)local_68);
              if (bVar5) {
                local_68._0_16_ = (undefined1  [16])QTableViewPrivate::visualSpanRect(this_00,span);
                cVar7 = QRect::intersects(&local_48);
                if (cVar7 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)local_68);
                }
              }
              QHashPrivate::iterator<QHashPrivate::Node<QSpanCollection::Span_*,_QHashDummyValue>_>
              ::operator++(&local_b8);
            }
            QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash
                      ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)&local_a0);
          }
        }
        QItemSelectionRange::~QItemSelectionRange(pQVar18);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0052d292:
      local_78 = QVar20;
      __stack_chk_fail();
    }
  }
  return (QRegion)this;
}

Assistant:

QRegion QTableView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTableView);

    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    bool verticalMoved = verticalHeader()->sectionsMoved();
    bool horizontalMoved = horizontalHeader()->sectionsMoved();

    if ((verticalMoved && horizontalMoved) || (d->hasSpans() && (verticalMoved || horizontalMoved))) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            for (int r = range.top(); r <= range.bottom(); ++r)
                for (int c = range.left(); c <= range.right(); ++c) {
                    const QRect &rangeRect = visualRect(d->model->index(r, c, d->root));
                    if (viewportRect.intersects(rangeRect))
                        selectionRegion += rangeRect;
                }
        }
    } else if (horizontalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int top = rowViewportPosition(range.top());
            int bottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            if (top > bottom)
                qSwap<int>(top, bottom);
            int height = bottom - top;
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else if (verticalMoved) {
        for (const auto &range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            int left = columnViewportPosition(range.left());
            int right = columnViewportPosition(range.right()) + columnWidth(range.right());
            if (left > right)
                qSwap<int>(left, right);
            int width = right - left;
            for (int r = range.top(); r <= range.bottom(); ++r) {
                const QRect rangeRect(left, rowViewportPosition(r), width, rowHeight(r));
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        }
    } else { // nothing moved
        const int gridAdjust = showGrid() ? 1 : 0;
        for (auto range : selection) {
            if (range.parent() != d->root || !range.isValid())
                continue;
            d->trimHiddenSelections(&range);

            const int rtop = rowViewportPosition(range.top());
            const int rbottom = rowViewportPosition(range.bottom()) + rowHeight(range.bottom());
            int rleft;
            int rright;
            if (isLeftToRight()) {
                rleft = columnViewportPosition(range.left());
                rright = columnViewportPosition(range.right()) + columnWidth(range.right());
            } else {
                rleft = columnViewportPosition(range.right());
                rright = columnViewportPosition(range.left()) + columnWidth(range.left());
            }
            const QRect rangeRect(QPoint(rleft, rtop), QPoint(rright - 1 - gridAdjust, rbottom - 1 - gridAdjust));
            if (viewportRect.intersects(rangeRect))
                selectionRegion += rangeRect;
            if (d->hasSpans()) {
                const auto spansInRect = d->spans.spansInRect(range.left(), range.top(), range.width(), range.height());
                for (QSpanCollection::Span *s : spansInRect) {
                    if (range.contains(s->top(), s->left(), range.parent())) {
                        const QRect &visualSpanRect = d->visualSpanRect(*s);
                        if (viewportRect.intersects(visualSpanRect))
                            selectionRegion += visualSpanRect;
                    }
                }
            }
        }
    }

    return selectionRegion;
}